

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void testing::internal::ShuffleRange<int>
               (Random *random,int begin,int end,vector<int,_std::allocator<int>_> *v)

{
  bool bVar1;
  int iVar2;
  UInt32 UVar3;
  size_type sVar4;
  ostream *poVar5;
  reference __a;
  reference __b;
  long in_FS_OFFSET;
  bool local_89;
  bool local_51;
  int selected;
  int last_in_range;
  int range_width;
  int size;
  vector<int,_std::allocator<int>_> *v_local;
  int end_local;
  int begin_local;
  Random *random_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  sVar4 = std::vector<int,_std::allocator<int>_>::size(v);
  iVar2 = (int)sVar4;
  local_51 = -1 < begin && begin <= iVar2;
  bVar1 = IsTrue(local_51);
  if (!bVar1) {
    GTestLog::GTestLog((GTestLog *)((long)&random_local + 4),GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-internal-inl.h"
                       ,0x137);
    poVar5 = GTestLog::GetStream((GTestLog *)((long)&random_local + 4));
    poVar5 = std::operator<<(poVar5,"Condition 0 <= begin && begin <= size failed. ");
    poVar5 = std::operator<<(poVar5,"Invalid shuffle range start ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,begin);
    poVar5 = std::operator<<(poVar5,": must be in range [0, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    std::operator<<(poVar5,"].");
    GTestLog::~GTestLog((GTestLog *)((long)&random_local + 4));
  }
  local_89 = begin <= end && end <= iVar2;
  bVar1 = IsTrue(local_89);
  if (!bVar1) {
    GTestLog::GTestLog((GTestLog *)&random_local,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-internal-inl.h"
                       ,0x13a);
    poVar5 = GTestLog::GetStream((GTestLog *)&random_local);
    poVar5 = std::operator<<(poVar5,"Condition begin <= end && end <= size failed. ");
    poVar5 = std::operator<<(poVar5,"Invalid shuffle range finish ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,end);
    poVar5 = std::operator<<(poVar5,": must be in range [");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,begin);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    std::operator<<(poVar5,"].");
    GTestLog::~GTestLog((GTestLog *)&random_local);
  }
  for (selected = end - begin; 1 < selected; selected = selected + -1) {
    UVar3 = Random::Generate(random,selected);
    __a = std::vector<int,_std::allocator<int>_>::operator[](v,(long)(int)(begin + UVar3));
    __b = std::vector<int,_std::allocator<int>_>::operator[](v,(long)(begin + selected + -1));
    std::swap<int>(__a,__b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ShuffleRange(internal::Random* random, int begin, int end,
                  std::vector<E>* v) {
  const int size = static_cast<int>(v->size());
  GTEST_CHECK_(0 <= begin && begin <= size)
      << "Invalid shuffle range start " << begin << ": must be in range [0, "
      << size << "].";
  GTEST_CHECK_(begin <= end && end <= size)
      << "Invalid shuffle range finish " << end << ": must be in range ["
      << begin << ", " << size << "].";

  // Fisher-Yates shuffle, from
  // http://en.wikipedia.org/wiki/Fisher-Yates_shuffle
  for (int range_width = end - begin; range_width >= 2; range_width--) {
    const int last_in_range = begin + range_width - 1;
    const int selected = begin + random->Generate(range_width);
    std::swap((*v)[selected], (*v)[last_in_range]);
  }
}